

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O3

void Sim_SimulateSeqFrame(Vec_Ptr_t *vInfo,Abc_Ntk_t *pNtk,int iFrames,int nWords,int fTransfer)

{
  Abc_Obj_t *pNode;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = pNtk->vObjs;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar1->pArray[lVar2];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Sim_UtilSimulateNodeOne(pNode,vInfo,nWords,nWords * iFrames);
        pVVar1 = pNtk->vObjs;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  pVVar1 = pNtk->vPos;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Sim_UtilTransferNodeOne((Abc_Obj_t *)pVVar1->pArray[lVar2],vInfo,nWords,nWords * iFrames,0);
      lVar2 = lVar2 + 1;
      pVVar1 = pNtk->vPos;
    } while (lVar2 < pVVar1->nSize);
  }
  if ((fTransfer != 0) && (pVVar1 = pNtk->vBoxes, 0 < pVVar1->nSize)) {
    lVar2 = 0;
    do {
      if ((*(uint *)&((Abc_Obj_t *)pVVar1->pArray[lVar2])->field_0x14 & 0xf) == 8) {
        Sim_UtilTransferNodeOne((Abc_Obj_t *)pVVar1->pArray[lVar2],vInfo,nWords,iFrames * nWords,1);
        pVVar1 = pNtk->vBoxes;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Sim_SimulateSeqFrame( Vec_Ptr_t * vInfo, Abc_Ntk_t * pNtk, int iFrames, int nWords, int fTransfer )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Sim_UtilSimulateNodeOne( pNode, vInfo, nWords, iFrames * nWords );
    Abc_NtkForEachPo( pNtk, pNode, i )
        Sim_UtilTransferNodeOne( pNode, vInfo, nWords, iFrames * nWords, 0 );
    if ( !fTransfer )
        return;
    Abc_NtkForEachLatch( pNtk, pNode, i )
        Sim_UtilTransferNodeOne( pNode, vInfo, nWords, iFrames * nWords, 1 );
}